

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAcurv::VariablesQbIncrementPosition(ChNodeFEAcurv *this)

{
  double in_XMM0_Qa;
  
  VariablesQbIncrementPosition
            ((ChNodeFEAcurv *)
             ((long)(this->m_ryy).m_data +
             (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x16] + -0x38)),in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAcurv::VariablesQbIncrementPosition(double step) {
    ChVector<> new_rxx_dt(m_variables->Get_qb().segment(0, 3));
    ChVector<> new_ryy_dt(m_variables->Get_qb().segment(3, 3));
    ChVector<> new_rzz_dt(m_variables->Get_qb().segment(6, 3));
    m_rxx = m_rxx + new_rxx_dt * step;
    m_ryy = m_ryy + new_ryy_dt * step;
    m_rzz = m_rzz + new_rzz_dt * step;
}